

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

count * __thiscall
lest::for_test<lest::count>(lest *this,tests *specification,texts *in,count *perform,int n)

{
  pointer *ppbVar1;
  test *ptVar2;
  int iVar3;
  int iVar4;
  fd_set *__exceptfds;
  int iVar5;
  fd_set *__writefds;
  test *ptVar6;
  undefined4 in_register_00000084;
  string local_90 [32];
  test local_70;
  
  iVar4 = (int)perform;
  iVar5 = 0;
  while( true ) {
    __exceptfds = (fd_set *)
                  (ulong)CONCAT31((int3)((ulong)perform >> 8),iVar5 < iVar4 || iVar4 == -1);
    if (iVar5 >= iVar4 && iVar4 != -1) break;
    ptVar2 = *(test **)(this + 8);
    for (ptVar6 = *(test **)this; ptVar6 != ptVar2; ptVar6 = ptVar6 + 1) {
      std::__cxx11::string::string(local_90,(string *)ptVar6);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xffffffffffffff58,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)specification);
      iVar3 = select((int)local_90,(fd_set *)&stack0xffffffffffffff58,__writefds,__exceptfds,
                     (timeval *)CONCAT44(in_register_00000084,n));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffff58);
      std::__cxx11::string::~string(local_90);
      if ((char)iVar3 != '\0') {
        test::test(&local_70,ptVar6);
        ppbVar1 = &(in->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *(int *)ppbVar1 = *(int *)ppbVar1 + 1;
        test::~test(&local_70);
      }
    }
    iVar5 = iVar5 + 1;
  }
  return (count *)in;
}

Assistant:

Action && for_test( tests specification, texts in, Action && perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( auto & testing : specification )
        {
            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return std::move( perform );
        }
    }
    return std::move( perform );
}